

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlneuron.cxx
# Opt level: O3

void __thiscall MlNeuron::prepareNextState(MlNeuron *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  char cVar3;
  
  DifferentialEquation::prepareNextState
            ((DifferentialEquation *)
             &(this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
              super_StochasticProcess.super_Physical.physicalUnit.sUnitSymbol);
  cVar3 = (char)(this->mlneuronMembrane).super_StochasticVariable.super_StochasticProcess.
                super_Physical.physicalUnit.siUnits[3];
  *(char *)((long)(this->super_SpikingNeuron).super_StochasticEventGenerator.
                  super_StochasticVariable.super_StochasticProcess.super_Physical.physicalUnit.
                  siUnits + 0xc) = cVar3;
  dVar2 = *(double *)
           ((this->mlneuronMembrane).super_StochasticVariable.super_StochasticProcess.super_Physical
            .physicalUnit.siUnits + 1);
  *(double *)
   ((long)(this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
          super_StochasticProcess.super_Physical.physicalUnit.siUnits + 4) = dVar2;
  if (cVar3 == '\x01') {
    paVar1 = &(this->mlneuronRelaxation).super_StochasticVariable.super_StochasticProcess.
              stochDescription.field_2;
    *(bool *)((long)&(this->super_SpikingNeuron).super_StochasticEventGenerator.
                     super_StochasticVariable.super_StochasticProcess.super_Physical.physicalUnit.
                     sUnitName + 0x19) = *(double *)paVar1 <= dVar2 && dVar2 != *(double *)paVar1;
  }
  return;
}

Assistant:

void MlNeuron::prepareNextState()
{
	// create next value of differential equation
	mlneuronMembrane.prepareNextState();
	stochNextStateIsPrepared = mlneuronMembrane.isNextStatePrepared();
	stochNextValue = mlneuronMembrane.getNextValue();
	
	// proceed if calculation was successful
	if (stochNextStateIsPrepared) {
		if (stochNextValue > mlneuronTheta)
			eventNextValue = true;
		else 
			eventNextValue = false;
	}
}